

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O2

double __thiscall ColorToGray::numericValue(ColorToGray *this,Token *token)

{
  allocator<char> local_49;
  double local_48;
  string local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_49);
  QPDFObjectHandle::parse(local_40,(string *)&token->value);
  local_48 = (double)QPDFObjectHandle::getNumericValue();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__cxx11::string::~string(local_30);
  return local_48;
}

Assistant:

double
ColorToGray::numericValue(QPDFTokenizer::Token const& token)
{
    return QPDFObjectHandle::parse(token.getValue()).getNumericValue();
}